

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O0

uint ZSTD_NbCommonBytes(size_t val)

{
  uint uVar1;
  size_t val_local;
  
  uVar1 = MEM_isLittleEndian();
  if (uVar1 == 0) {
    uVar1 = MEM_64bits();
    if (uVar1 == 0) {
      uVar1 = ZSTD_countLeadingZeros32((U32)val);
      val_local._4_4_ = uVar1 >> 3;
    }
    else {
      uVar1 = ZSTD_countLeadingZeros64(val);
      val_local._4_4_ = uVar1 >> 3;
    }
  }
  else {
    uVar1 = MEM_64bits();
    if (uVar1 == 0) {
      uVar1 = ZSTD_countTrailingZeros32((U32)val);
      val_local._4_4_ = uVar1 >> 3;
    }
    else {
      uVar1 = ZSTD_countTrailingZeros64(val);
      val_local._4_4_ = uVar1 >> 3;
    }
  }
  return val_local._4_4_;
}

Assistant:

MEM_STATIC unsigned ZSTD_NbCommonBytes(size_t val)
{
    if (MEM_isLittleEndian()) {
        if (MEM_64bits()) {
            return ZSTD_countTrailingZeros64((U64)val) >> 3;
        } else {
            return ZSTD_countTrailingZeros32((U32)val) >> 3;
        }
    } else {  /* Big Endian CPU */
        if (MEM_64bits()) {
            return ZSTD_countLeadingZeros64((U64)val) >> 3;
        } else {
            return ZSTD_countLeadingZeros32((U32)val) >> 3;
        }
    }
}